

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O2

void type_error(char *type_name,Am_Value *value)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"** Stored value of Am_Value is not of ");
  poVar1 = std::operator<<(poVar1,type_name);
  poVar1 = std::operator<<(poVar1," type.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cerr,"** It contains a value of type ");
  Am_Print_Type((ostream *)&std::cerr,value->type);
  poVar1 = std::operator<<((ostream *)&std::cerr,".");
  std::endl<char,std::char_traits<char>>(poVar1);
  Am_Error();
}

Assistant:

static void
type_error(const char *type_name, const Am_Value &value)
{
  std::cerr << "** Stored value of Am_Value is not of " << type_name << " type."
            << std::endl;
  std::cerr << "** It contains a value of type ";
  Am_Print_Type(std::cerr, value.type);
  std::cerr << "." << std::endl;
  Am_Error();
}